

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O2

void __thiscall
duckdb::DlbaEncoder::WriteValue<duckdb::string_t>
          (DlbaEncoder *this,WriteStream *writer,string_t *value)

{
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> _Var1;
  char *pcVar2;
  ulong local_18;
  
  local_18 = (ulong)(value->value).pointer.length;
  DbpEncoder::WriteValueInternal(&this->dbp_encoder,writer,(int64_t *)&local_18);
  _Var1._M_head_impl =
       (this->stream).
       super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
       super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
  if ((value->value).pointer.length < 0xd) {
    pcVar2 = (char *)((long)&value->value + 4);
  }
  else {
    pcVar2 = (value->value).pointer.ptr;
  }
  (*(code *)*((_Var1._M_head_impl)->super_WriteStream)._vptr_WriteStream)(_Var1._M_head_impl,pcVar2)
  ;
  return;
}

Assistant:

inline void DlbaEncoder::WriteValue(WriteStream &writer, const string_t &value) {
	dbp_encoder.WriteValue(writer, UnsafeNumericCast<int64_t>(value.GetSize()));
	stream->WriteData(const_data_ptr_cast(value.GetData()), value.GetSize());
}